

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvastrscan.c
# Opt level: O3

int main(int argc,char **argv)

{
  uint uVar1;
  void *pvVar2;
  int iVar3;
  uint uVar4;
  uint32_t *puVar5;
  nva_card **ppnVar6;
  ulong uVar7;
  uint32_t (*pauVar8) [6];
  long *plVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  int __sig;
  long lVar14;
  ulong uVar15;
  bool bVar16;
  bool bVar17;
  long lStack_48048;
  ulong uStack_48040;
  uint32_t tab [12288] [6];
  
  iVar3 = nva_init();
  if (iVar3 == 0) {
    do {
      while (iVar3 = getopt(argc,argv,"c:"), iVar3 == 99) {
        __isoc99_sscanf(_optarg,"%d",&cnum);
      }
    } while (iVar3 != -1);
    if (cnum < nva_cardsnum) {
      pvVar2 = nva_cards[cnum]->bar0;
      *(undefined4 *)((long)pvVar2 + 0x200) = 0xffffefff;
      *(undefined4 *)((long)pvVar2 + 0x200) = 0xffffffff;
      *(undefined4 *)((long)pvVar2 + 0x400040) = 0xffffffff;
      *(undefined4 *)((long)pvVar2 + 0x400040) = 0;
      *(undefined4 *)((long)pvVar2 + 0x400080) = 0x3083c2;
      *(undefined4 *)((long)pvVar2 + 0x400088) = 0x6fe7;
      *(undefined4 *)((long)pvVar2 + 0x1700) = 0x400;
      *(undefined4 *)((long)pvVar2 + 0x700020) = 0x190000;
      *(undefined4 *)((long)pvVar2 + 0x700024) = 0x4080000;
      *(undefined4 *)((long)pvVar2 + 0x700028) = 0x4010000;
      *(undefined4 *)((long)pvVar2 + 0x70002c) = 0;
      *(undefined4 *)((long)pvVar2 + 0x700030) = 0;
      *(undefined4 *)((long)pvVar2 + 0x700034) = 0x10000;
      *(undefined4 *)((long)pvVar2 + 0x700200) = 0x190000;
      *(undefined4 *)((long)pvVar2 + 0x700204) = 0x4080000;
      *(undefined4 *)((long)pvVar2 + 0x700208) = 0x4010000;
      *(undefined4 *)((long)pvVar2 + 0x70020c) = 0;
      *(undefined4 *)((long)pvVar2 + 0x700210) = 0;
      *(undefined4 *)((long)pvVar2 + 0x700214) = 0x10000;
      lVar14 = 0;
      do {
        iVar3 = (int)lVar14;
        uVar15 = (ulong)(uint)(iVar3 * 4) | 0xffffffffffffffe0;
        __sig = iVar3;
        printf("Strand %d!\n");
        lStack_48048 = lVar14;
        kill(iVar3,__sig);
        ppnVar6 = nva_cards;
        uVar7 = 0xfffffffffffffffc;
        do {
          *(undefined4 *)((long)ppnVar6[cnum]->bar0 + uVar7 + 0x710004) = 0xdeafbeef;
          uVar7 = uVar7 + 4;
        } while (uVar7 < 0x6fffc);
        pvVar2 = ppnVar6[cnum]->bar0;
        *(undefined4 *)((long)pvVar2 + 0x400824) = 0x4001;
        *(undefined4 *)((long)pvVar2 + 0x400304) = 1;
        strwait();
        ppnVar6 = nva_cards;
        uVar4 = (uint)lStack_48048 & 7;
        uStack_48040 = (ulong)uVar4;
        uVar4 = uVar4 * 4;
        pvVar2 = nva_cards[cnum]->bar0;
        pauVar8 = tab;
        uVar7 = uVar15;
        do {
          (*pauVar8)[0] = *(uint32_t *)((long)pvVar2 + uVar7 + 0x710020);
          uVar7 = uVar7 + 0x20;
          pauVar8 = pauVar8 + 1;
        } while (uVar7 < 0x5ffe0);
        uVar7 = 0xfffffffffffffffc;
        do {
          *(undefined4 *)((long)ppnVar6[cnum]->bar0 + uVar7 + 0x710004) = 0;
          uVar7 = uVar7 + 4;
        } while (uVar7 < 0x6fffc);
        pvVar2 = ppnVar6[cnum]->bar0;
        *(undefined4 *)((long)pvVar2 + 0x400824) = 0x4000;
        *(undefined4 *)((long)pvVar2 + 0x400304) = 1;
        strwait();
        ppnVar6 = nva_cards;
        uVar7 = 0xfffffffffffffffc;
        do {
          *(undefined4 *)((long)ppnVar6[cnum]->bar0 + uVar7 + 0x710004) = 0;
          uVar7 = uVar7 + 4;
        } while (uVar7 < 0x6fffc);
        pvVar2 = ppnVar6[cnum]->bar0;
        *(undefined4 *)((long)pvVar2 + 0x400824) = 0x4001;
        *(undefined4 *)((long)pvVar2 + 0x400304) = 1;
        strwait();
        ppnVar6 = nva_cards;
        pvVar2 = nva_cards[cnum]->bar0;
        puVar5 = tab[0] + 1;
        uVar7 = uVar15;
        do {
          *puVar5 = *(uint32_t *)((long)pvVar2 + uVar7 + 0x710020);
          uVar7 = uVar7 + 0x20;
          puVar5 = puVar5 + 6;
        } while (uVar7 < 0x5ffe0);
        uVar7 = 0xfffffffffffffffc;
        do {
          *(undefined4 *)((long)ppnVar6[cnum]->bar0 + uVar7 + 0x710004) = 0xffffffff;
          uVar7 = uVar7 + 4;
        } while (uVar7 < 0x6fffc);
        pvVar2 = ppnVar6[cnum]->bar0;
        *(undefined4 *)((long)pvVar2 + 0x400824) = 0x4000;
        *(undefined4 *)((long)pvVar2 + 0x400304) = 1;
        strwait();
        ppnVar6 = nva_cards;
        uVar7 = 0xfffffffffffffffc;
        do {
          *(undefined4 *)((long)ppnVar6[cnum]->bar0 + uVar7 + 0x710004) = 0;
          uVar7 = uVar7 + 4;
        } while (uVar7 < 0x6fffc);
        pvVar2 = ppnVar6[cnum]->bar0;
        *(undefined4 *)((long)pvVar2 + 0x400824) = 0x4001;
        *(undefined4 *)((long)pvVar2 + 0x400304) = 1;
        strwait();
        ppnVar6 = nva_cards;
        pvVar2 = nva_cards[cnum]->bar0;
        uVar7 = uVar15;
        plVar9 = &lStack_48048;
        do {
          plVar9 = (long *)((long)plVar9 + 0x18);
          *(undefined4 *)plVar9 = *(undefined4 *)((long)pvVar2 + uVar7 + 0x710020);
          uVar7 = uVar7 + 0x20;
        } while (uVar7 < 0x5ffe0);
        uVar7 = 0xfffffffffffffffc;
        do {
          *(undefined4 *)((long)ppnVar6[cnum]->bar0 + uVar7 + 0x710004) = 0;
          uVar7 = uVar7 + 4;
        } while (uVar7 < 0x6fffc);
        pvVar2 = ppnVar6[cnum]->bar0;
        *(undefined4 *)((long)pvVar2 + 0x400824) = 0x4008;
        *(undefined4 *)((long)pvVar2 + 0x400304) = 1;
        strwait();
        ppnVar6 = nva_cards;
        uVar7 = 0xfffffffffffffffc;
        do {
          *(undefined4 *)((long)ppnVar6[cnum]->bar0 + uVar7 + 0x710004) = 0;
          uVar7 = uVar7 + 4;
        } while (uVar7 < 0x6fffc);
        pvVar2 = ppnVar6[cnum]->bar0;
        *(undefined4 *)((long)pvVar2 + 0x400824) = 0x4009;
        *(undefined4 *)((long)pvVar2 + 0x400304) = 1;
        strwait();
        ppnVar6 = nva_cards;
        pvVar2 = nva_cards[cnum]->bar0;
        puVar5 = tab[0] + 3;
        uVar7 = uVar15;
        do {
          *puVar5 = *(uint32_t *)((long)pvVar2 + uVar7 + 0x710020);
          uVar7 = uVar7 + 0x20;
          puVar5 = puVar5 + 6;
        } while (uVar7 < 0x5ffe0);
        uVar7 = 0xfffffffffffffffc;
        do {
          *(undefined4 *)((long)ppnVar6[cnum]->bar0 + uVar7 + 0x710004) = 0xffffffff;
          uVar7 = uVar7 + 4;
        } while (uVar7 < 0x6fffc);
        pvVar2 = ppnVar6[cnum]->bar0;
        *(undefined4 *)((long)pvVar2 + 0x400824) = 0x4008;
        *(undefined4 *)((long)pvVar2 + 0x400304) = 1;
        strwait();
        ppnVar6 = nva_cards;
        uVar7 = 0xfffffffffffffffc;
        do {
          *(undefined4 *)((long)ppnVar6[cnum]->bar0 + uVar7 + 0x710004) = 0;
          uVar7 = uVar7 + 4;
        } while (uVar7 < 0x6fffc);
        pvVar2 = ppnVar6[cnum]->bar0;
        *(undefined4 *)((long)pvVar2 + 0x400824) = 0x4009;
        *(undefined4 *)((long)pvVar2 + 0x400304) = 1;
        strwait();
        pvVar2 = nva_cards[cnum]->bar0;
        puVar5 = tab[0] + 5;
        uVar7 = uVar15;
        do {
          puVar5[-1] = *(uint *)((long)pvVar2 + uVar7 + 0x710020);
          *puVar5 = 0;
          uVar7 = uVar7 + 0x20;
          puVar5 = puVar5 + 6;
        } while (uVar7 < 0x5ffe0);
        iVar3 = 0;
        do {
          ppnVar6 = nva_cards;
          uVar7 = 0xfffffffffffffffc;
          do {
            *(undefined4 *)((long)ppnVar6[cnum]->bar0 + uVar7 + 0x710004) = 0xffffffff;
            uVar7 = uVar7 + 4;
          } while (uVar7 < 0x6fffc);
          pvVar2 = ppnVar6[cnum]->bar0;
          *(undefined4 *)((long)pvVar2 + 0x400824) = 0x4008;
          *(undefined4 *)((long)pvVar2 + 0x400304) = 1;
          strwait();
          uVar13 = 1 << ((byte)iVar3 & 0x1f);
          pvVar2 = nva_cards[cnum]->bar0;
          *(uint *)((long)pvVar2 + 0x400040) = uVar13;
          *(undefined4 *)((long)pvVar2 + 0x400040) = 0;
          strwait();
          ppnVar6 = nva_cards;
          uVar7 = 0xfffffffffffffffc;
          do {
            *(undefined4 *)((long)ppnVar6[cnum]->bar0 + uVar7 + 0x710004) = 0;
            uVar7 = uVar7 + 4;
          } while (uVar7 < 0x6fffc);
          pvVar2 = ppnVar6[cnum]->bar0;
          *(undefined4 *)((long)pvVar2 + 0x400824) = 0x4009;
          *(undefined4 *)((long)pvVar2 + 0x400304) = 1;
          strwait();
          lVar14 = lStack_48048;
          pvVar2 = nva_cards[cnum]->bar0;
          puVar5 = tab[0] + 5;
          uVar7 = uVar15;
          do {
            if (puVar5[-1] != *(uint *)((long)pvVar2 + uVar7 + 0x710020)) {
              *puVar5 = *puVar5 | uVar13;
            }
            uVar7 = uVar7 + 0x20;
            puVar5 = puVar5 + 6;
          } while (uVar7 < 0x5ffe0);
          iVar3 = iVar3 + 1;
        } while (iVar3 != 0x20);
        puVar5 = tab[0] + 4;
        uVar7 = 0;
        do {
          if (((*(uint32_t (*) [6])(puVar5 + -4))[0] == 0xdeafbeef) && (*puVar5 == 0)) {
            slen[lStack_48048] = (int)uVar7;
            goto LAB_00102ebb;
          }
          uVar7 = uVar7 + 1;
          puVar5 = puVar5 + 6;
        } while (uVar7 != 0x3000);
        uVar7 = (ulong)(uint)slen[lStack_48048];
LAB_00102ebb:
        uVar11 = 0;
        uVar13 = uVar11;
        if (((int)uVar7 != 0) && (printf("Initial length: %04x\n"), slen[lVar14] != 0)) {
          ppnVar6 = nva_cards;
          do {
            uVar7 = 0xfffffffffffffffc;
            do {
              *(undefined4 *)((long)ppnVar6[cnum]->bar0 + uVar7 + 0x710004) = 0;
              uVar7 = uVar7 + 4;
            } while (uVar7 < 0x6fffc);
            *(undefined4 *)
             ((long)ppnVar6[cnum]->bar0 + (ulong)(slen[lVar14] * 0x20 + uVar4 + 0x70ffe0)) =
                 0xffffffff;
            pvVar2 = ppnVar6[cnum]->bar0;
            *(undefined4 *)((long)pvVar2 + 0x400824) = 0x4008;
            *(undefined4 *)((long)pvVar2 + 0x400304) = 1;
            strwait();
            ppnVar6 = nva_cards;
            uVar7 = 0xfffffffffffffffc;
            do {
              *(undefined4 *)((long)ppnVar6[cnum]->bar0 + uVar7 + 0x710004) = 0;
              uVar7 = uVar7 + 4;
            } while (uVar7 < 0x6fffc);
            pvVar2 = ppnVar6[cnum]->bar0;
            *(undefined4 *)((long)pvVar2 + 0x400824) = 0x4009;
            *(undefined4 *)((long)pvVar2 + 0x400304) = 1;
            strwait();
            ppnVar6 = nva_cards;
            uVar1 = slen[lVar14];
            uVar13 = uVar1;
          } while ((*(int *)((long)nva_cards[cnum]->bar0 + (ulong)(uVar1 * 0x20 + uVar4 + 0x70ffe0))
                    == 0) && (slen[lVar14] = uVar1 - 1, uVar13 = uVar11, uVar1 - 1 != 0));
        }
        printf("Length: %04x\n",(ulong)uVar13);
        iVar3 = (int)uStack_48040;
        lVar10 = 0;
        do {
          uVar7 = 1;
          uStack_48040 = lVar10;
          do {
            ppnVar6 = nva_cards;
            uVar15 = 0xfffffffffffffffc;
            do {
              *(undefined4 *)((long)ppnVar6[cnum]->bar0 + uVar15 + 0x710004) = 0;
              uVar15 = uVar15 + 4;
            } while (uVar15 < 0x6fffc);
            pvVar2 = ppnVar6[cnum]->bar0;
            *(undefined4 *)((long)pvVar2 + 0x400824) = 0x4008;
            *(undefined4 *)((long)pvVar2 + 0x400304) = 1;
            strwait();
            ppnVar6 = nva_cards;
            uVar15 = 0;
            do {
              *(undefined4 *)((long)ppnVar6[cnum]->bar0 + uVar15 * 4 + 0x400420) = 0xffffffff;
              uVar15 = uVar15 + 1;
            } while (uVar7 != uVar15);
            pvVar2 = ppnVar6[cnum]->bar0;
            *(int *)((long)pvVar2 + 0x400408) = (int)lVar10 << 0x10;
            *(uint *)((long)pvVar2 + 0x400404) =
                 (int)uVar7 + (((uint)lVar14 & 8) << 9 | iVar3 << 8) + 0x30000;
            strwait();
            pvVar2 = nva_cards[cnum]->bar0;
            *(undefined4 *)((long)pvVar2 + 0x400824) = 0x4009;
            *(undefined4 *)((long)pvVar2 + 0x400304) = 1;
            strwait();
            uVar13 = 0xffffffff;
            uVar12 = 0;
            uVar15 = 0;
            do {
              bVar16 = *(int *)((long)nva_cards[cnum]->bar0 + uVar15 + 0x710000) != 0;
              bVar17 = ((uint)uVar15 & 0x1c) == uVar4;
              uVar11 = (uint)(uVar15 >> 5) & 0x7ffffff;
              if (uVar13 != 0xffffffff) {
                uVar11 = uVar13;
              }
              if (!bVar17 || !bVar16) {
                uVar11 = uVar13;
              }
              uVar13 = uVar11;
              uVar11 = (int)uVar12 + (uint)(bVar17 && bVar16);
              uVar12 = (ulong)uVar11;
              bVar16 = uVar15 < 0x6fffc;
              uVar15 = uVar15 + 4;
            } while (bVar16);
            if (uVar11 - 1 < uVar7) goto LAB_001031b0;
            uVar7 = uVar7 + 1;
          } while (uVar7 != 0x14);
          uVar7 = 0x14;
LAB_001031b0:
          if (uVar13 == 0xffffffff) {
            seekcnt[lStack_48048] = (int)uStack_48040;
            break;
          }
          if (uVar11 != (uint)uVar7) {
            __assert_fail("ctr == l",
                          "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/nva/nvastrscan.c"
                          ,0x106,"int main(int, char **)");
          }
          printf("SEEK: %04x [%d/%d]...\n",(ulong)uVar13,(ulong)uVar11,uVar12);
          seekstart[lStack_48048][uStack_48040] = uVar13;
          seeksize[lStack_48048][uStack_48040] = uVar11;
          lVar10 = uStack_48040 + 1;
        } while (lVar10 != 0x400);
        if (0 < slen[lStack_48048]) {
          uVar7 = 0;
          puVar5 = tab[0] + 5;
          uVar4 = 0;
          do {
            if (((int)uVar4 < seekcnt[lStack_48048]) &&
               (uVar7 == (uint)seekstart[lStack_48048][(int)uVar4])) {
              printf("\nSEEK %03x [unit %x]\n",(ulong)uVar4,
                     (ulong)(uint)seeksize[lStack_48048][(int)uVar4]);
              uVar4 = uVar4 + 1;
            }
            else if (uVar4 == 0) {
              uVar4 = 0;
            }
            else {
              iVar3 = *(int *)(lStack_48048 * 0x1000 + 0x118abc + (long)(int)uVar4 * 4);
              if ((iVar3 != 1) &&
                 (((int)uVar7 - seekstart[lStack_48048 + -1][(long)(int)uVar4 + 0x3ff]) % iVar3 == 0
                 )) {
                putchar(10);
              }
            }
            printf("%04x: %08x %08x %08x %08x %08x %08x\n",uVar7 & 0xffffffff,
                   (ulong)(*(uint32_t (*) [6])(puVar5 + -5))[0],(ulong)puVar5[-4],(ulong)puVar5[-3],
                   (ulong)puVar5[-2],(ulong)puVar5[-1],(ulong)*puVar5);
            uVar7 = uVar7 + 1;
            puVar5 = puVar5 + 6;
          } while ((long)uVar7 < (long)slen[lStack_48048]);
        }
        lVar14 = lStack_48048 + 1;
        if (lVar14 == 0x10) {
          return 0;
        }
      } while( true );
    }
    if (nva_cardsnum == 0) {
      main_cold_3();
    }
    else {
      main_cold_2();
    }
  }
  else {
    main_cold_1();
  }
  return 1;
}

Assistant:

int main(int argc, char **argv){
	if (nva_init()) {
		fprintf (stderr, "PCI init failure!\n");
		return 1;
	}
	int c;
	while ((c = getopt (argc, argv, "c:")) != -1)
		switch (c) {
			case 'c':
				sscanf(optarg, "%d", &cnum);
				break;
		}
	if (cnum >= nva_cardsnum) {
		if (nva_cardsnum)
			fprintf (stderr, "No such card.\n");
		else
			fprintf (stderr, "No cards found.\n");
		return 1;
	}
	nv50_graph_reset();
	nva_wr32(cnum, 0x1700, 0x400);
	nva_wr32(cnum, 0x700020, 0x190000);
	nva_wr32(cnum, 0x700024, 0x4000000 + 0x80000);
	nva_wr32(cnum, 0x700028, 0x4000000 + 0x10000);
	nva_wr32(cnum, 0x70002c, 0);
	nva_wr32(cnum, 0x700030, 0);
	nva_wr32(cnum, 0x700034, 0x10000);
	nva_wr32(cnum, 0x700200, 0x190000);
	nva_wr32(cnum, 0x700204, 0x4000000 + 0x80000);
	nva_wr32(cnum, 0x700208, 0x4000000 + 0x10000);
	nva_wr32(cnum, 0x70020c, 0);
	nva_wr32(cnum, 0x700210, 0);
	nva_wr32(cnum, 0x700214, 0x10000);

	int j;
	int k;

	for (j = 0; j < 16; j++) {
		printf ("Strand %d!\n", j);
		uint32_t tab[0x3000][6];
		kill(j);
		for (k = 0; k < 0x70000; k += 4)
			nva_wr32(cnum, 0x710000 + k, 0xdeafbeef);
		strread(j, 0);
		for (k = 4*(j&7); k < 0x3000*32; k += 4*8) {
			tab[k/32][0] = nva_rd32(cnum, 0x710000 + k);
		}

		for (k = 0; k < 0x70000; k += 4)
			nva_wr32(cnum, 0x710000 + k, 0);
		strwrite(j, 0);
		for (k = 0; k < 0x70000; k += 4)
			nva_wr32(cnum, 0x710000 + k, 0);
		strread(j, 0);
		for (k = 4*(j&7); k < 0x3000*32; k += 4*8) {
			tab[k/32][1] = nva_rd32(cnum, 0x710000 + k);
		}

		for (k = 0; k < 0x70000; k += 4)
			nva_wr32(cnum, 0x710000 + k, -1);
		strwrite(j, 0);
		for (k = 0; k < 0x70000; k += 4)
			nva_wr32(cnum, 0x710000 + k, 0);
		strread(j, 0);
		for (k = 4*(j&7); k < 0x3000*32; k += 4*8) {
			tab[k/32][2] = nva_rd32(cnum, 0x710000 + k);
		}

		for (k = 0; k < 0x70000; k += 4)
			nva_wr32(cnum, 0x710000 + k, 0);
		strwrite(j, 8);
		for (k = 0; k < 0x70000; k += 4)
			nva_wr32(cnum, 0x710000 + k, 0);
		strread(j, 8);
		for (k = 4*(j&7); k < 0x3000*32; k += 4*8) {
			tab[k/32][3] = nva_rd32(cnum, 0x710000 + k);
		}

		for (k = 0; k < 0x70000; k += 4)
			nva_wr32(cnum, 0x710000 + k, -1);
		strwrite(j, 8);
		for (k = 0; k < 0x70000; k += 4)
			nva_wr32(cnum, 0x710000 + k, 0);
		strread(j, 8);
		for (k = 4*(j&7); k < 0x3000*32; k += 4*8) {
			tab[k/32][4] = nva_rd32(cnum, 0x710000 + k);
			tab[k/32][5] = 0;
		}

		int z;
		for (z = 0; z < 32; z++) {
			for (k = 0; k < 0x70000; k += 4)
				nva_wr32(cnum, 0x710000 + k, -1);
			strwrite(j, 8);
			nva_wr32(cnum, 0x400040, 1 << z);
			nva_wr32(cnum, 0x400040, 0);
			strwait();
			for (k = 0; k < 0x70000; k += 4)
				nva_wr32(cnum, 0x710000 + k, 0);
			strread(j, 8);
			for (k = 4*(j&7); k < 0x3000*32; k += 4*8) {
				if (tab[k/32][4] != nva_rd32(cnum, 0x710000 + k))
					tab[k/32][5] |= 1 << z;
			}
		}

		for (k = 0; k < 0x3000; k++)
			if (tab[k][0] == 0xdeafbeef && !tab[k][4]) {
				slen[j] = k;
				break;
			}

		if (slen[j]) {
			printf ("Initial length: %04x\n", slen[j]);
			while (slen[j]) {
				for (k = 0; k < 0x70000; k += 4)
					nva_wr32(cnum, 0x710000 + k, 0);
				nva_wr32(cnum, 0x710000 + (j&7)*4 + (slen[j] - 1) * 32, 0xffffffff);
				strwrite(j, 8);
				for (k = 0; k < 0x70000; k += 4)
					nva_wr32(cnum, 0x710000 + k, 0);
				strread(j, 8);
				if (nva_rd32(cnum, 0x710000 + (j&7)*4 + (slen[j] - 1) * 32)) {
					break;
				} else {
					slen[j]--;
				}
			}
		}
		printf ("Length: %04x\n", slen[j]);

		int i;
		for (i = 0; i < 0x400; i++) {
			int pos = -1;
			int l;
			int ctr = 0;
//			int try;
			for (l = 1; l < 0x14; l++) {
//				try = 0;
//respin:
				for (k = 0; k < 0x70000; k += 4)
					nva_wr32(cnum, 0x710000 + k, 0);
				strwrite(j, 8);
				for (k = 0; k < l; k++)
					nva_wr32(cnum, 0x400420 + k * 4, 0xffffffff);
				nva_wr32(cnum, 0x400408, i << 16);
				nva_wr32(cnum, 0x400404, 0x30000 | (j & 7) << 8 | (j&8) << (12-3) | l);
				strwait();
				strread(j, 8);
				ctr = 0;
				pos = -1;
				for (k = 0; k < 0x70000; k += 4)
					if (nva_rd32(cnum, 0x710000 + k) && (k & 0x1c) == (j & 7) << 2) {
						if (pos == -1)
							pos = k / 32;
						ctr++;
//						printf ("%04x: %08x\n", k/32, nva_rd32(cnum, 0x710000 + k));
					}
				if (ctr <= l && ctr)
					break;
//				else
//					if (try++ < 4)
//						goto respin;
			}
			if (pos == -1) {
				seekcnt[j] = i;
				break;
			}
			assert(ctr == l);
			printf ("SEEK: %04x [%d/%d]...\n", pos, ctr, l);
			seekstart[j][i] = pos;
			seeksize[j][i] = l;
		}

		i = 0;
		for (k = 0; k < slen[j]; k++) {
			if (i < seekcnt[j] && k == seekstart[j][i]) {
				printf ("\nSEEK %03x [unit %x]\n", i, seeksize[j][i]);
				i++;
			} else if (i && seeksize[j][i-1] != 1 && !((k - seekstart[j][i-1])%seeksize[j][i-1]))
				printf ("\n");
			printf ("%04x: %08x %08x %08x %08x %08x %08x\n", k, tab[k][0], tab[k][1], tab[k][2], tab[k][3], tab[k][4], tab[k][5]);
		}
	}


	return 0;
}